

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O0

void __thiscall
btDbvt::collideTTpersistentStack(btDbvt *this,btDbvtNode *root0,btDbvtNode *root1,ICollide *policy)

{
  int iVar1;
  bool bVar2;
  sStkNN *psVar3;
  long *in_RCX;
  btDbvtNode *in_RDX;
  btDbvtNode *in_RSI;
  sStkNN *in_RDI;
  sStkNN p;
  int treshold;
  int depth;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  btDbvtNode *in_stack_fffffffffffffef0;
  sStkNN local_108;
  sStkNN local_f8;
  sStkNN local_e8;
  sStkNN local_d8;
  sStkNN local_c8;
  sStkNN local_b8;
  sStkNN local_a8;
  sStkNN local_98;
  sStkNN local_88;
  sStkNN local_78;
  sStkNN local_68;
  btDbvtNode *local_58;
  btDbvtNode *local_50;
  sStkNN local_48;
  sStkNN local_38;
  int local_28;
  int local_24;
  long *local_20;
  btDbvtNode *local_18;
  btDbvtNode *local_10;
  
  if ((in_RSI != (btDbvtNode *)0x0) && (in_RDX != (btDbvtNode *)0x0)) {
    local_24 = 1;
    local_28 = 0x7c;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    sStkNN::sStkNN(&local_38);
    btAlignedObjectArray<btDbvt::sStkNN>::resize
              ((btAlignedObjectArray<btDbvt::sStkNN> *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec,in_RDI);
    sStkNN::sStkNN(&local_48,local_10,local_18);
    psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[]
                       ((btAlignedObjectArray<btDbvt::sStkNN> *)(in_RDI + 2),0);
    psVar3->a = local_48.a;
    psVar3->b = local_48.b;
    do {
      local_24 = local_24 + -1;
      psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[]
                         ((btAlignedObjectArray<btDbvt::sStkNN> *)(in_RDI + 2),local_24);
      local_58 = psVar3->a;
      local_50 = psVar3->b;
      if (local_28 < local_24) {
        btAlignedObjectArray<btDbvt::sStkNN>::size
                  ((btAlignedObjectArray<btDbvt::sStkNN> *)(in_RDI + 2));
        sStkNN::sStkNN(&local_68);
        btAlignedObjectArray<btDbvt::sStkNN>::resize
                  ((btAlignedObjectArray<btDbvt::sStkNN> *)in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffeec,in_RDI);
        local_28 = btAlignedObjectArray<btDbvt::sStkNN>::size
                             ((btAlignedObjectArray<btDbvt::sStkNN> *)(in_RDI + 2));
        local_28 = local_28 + -4;
      }
      if (local_58 == local_50) {
        bVar2 = btDbvtNode::isinternal((btDbvtNode *)0x162f50);
        if (bVar2) {
          sStkNN::sStkNN(&local_78,(local_58->field_2).childs[0],(local_58->field_2).childs[0]);
          iVar1 = local_24;
          local_24 = local_24 + 1;
          psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[]
                             ((btAlignedObjectArray<btDbvt::sStkNN> *)(in_RDI + 2),iVar1);
          psVar3->a = local_78.a;
          psVar3->b = local_78.b;
          sStkNN::sStkNN(&local_88,(local_58->field_2).childs[1],(local_58->field_2).childs[1]);
          iVar1 = local_24;
          local_24 = local_24 + 1;
          psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[]
                             ((btAlignedObjectArray<btDbvt::sStkNN> *)(in_RDI + 2),iVar1);
          psVar3->a = local_88.a;
          psVar3->b = local_88.b;
          sStkNN::sStkNN(&local_98,(local_58->field_2).childs[0],(local_58->field_2).childs[1]);
          iVar1 = local_24;
          local_24 = local_24 + 1;
          psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[]
                             ((btAlignedObjectArray<btDbvt::sStkNN> *)(in_RDI + 2),iVar1);
          psVar3->a = local_98.a;
          psVar3->b = local_98.b;
        }
      }
      else {
        bVar2 = Intersect(&in_stack_fffffffffffffef0->volume,
                          (btDbvtAabbMm *)
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        if (bVar2) {
          bVar2 = btDbvtNode::isinternal((btDbvtNode *)0x1630a0);
          if (bVar2) {
            bVar2 = btDbvtNode::isinternal((btDbvtNode *)0x1630b6);
            if (bVar2) {
              sStkNN::sStkNN(&local_a8,(local_58->field_2).childs[0],(local_50->field_2).childs[0]);
              iVar1 = local_24;
              local_24 = local_24 + 1;
              psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[]
                                 ((btAlignedObjectArray<btDbvt::sStkNN> *)(in_RDI + 2),iVar1);
              psVar3->a = local_a8.a;
              psVar3->b = local_a8.b;
              sStkNN::sStkNN(&local_b8,(local_58->field_2).childs[1],(local_50->field_2).childs[0]);
              iVar1 = local_24;
              local_24 = local_24 + 1;
              psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[]
                                 ((btAlignedObjectArray<btDbvt::sStkNN> *)(in_RDI + 2),iVar1);
              psVar3->a = local_b8.a;
              psVar3->b = local_b8.b;
              sStkNN::sStkNN(&local_c8,(local_58->field_2).childs[0],(local_50->field_2).childs[1]);
              iVar1 = local_24;
              local_24 = local_24 + 1;
              psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[]
                                 ((btAlignedObjectArray<btDbvt::sStkNN> *)(in_RDI + 2),iVar1);
              psVar3->a = local_c8.a;
              psVar3->b = local_c8.b;
              sStkNN::sStkNN(&local_d8,(local_58->field_2).childs[1],(local_50->field_2).childs[1]);
              iVar1 = local_24;
              local_24 = local_24 + 1;
              psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[]
                                 ((btAlignedObjectArray<btDbvt::sStkNN> *)(in_RDI + 2),iVar1);
              psVar3->a = local_d8.a;
              psVar3->b = local_d8.b;
            }
            else {
              sStkNN::sStkNN(&local_e8,(local_58->field_2).childs[0],local_50);
              iVar1 = local_24;
              local_24 = local_24 + 1;
              psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[]
                                 ((btAlignedObjectArray<btDbvt::sStkNN> *)(in_RDI + 2),iVar1);
              psVar3->a = local_e8.a;
              psVar3->b = local_e8.b;
              sStkNN::sStkNN(&local_f8,(local_58->field_2).childs[1],local_50);
              iVar1 = local_24;
              local_24 = local_24 + 1;
              psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[]
                                 ((btAlignedObjectArray<btDbvt::sStkNN> *)(in_RDI + 2),iVar1);
              psVar3->a = local_f8.a;
              psVar3->b = local_f8.b;
            }
          }
          else {
            bVar2 = btDbvtNode::isinternal((btDbvtNode *)0x1632d8);
            if (bVar2) {
              sStkNN::sStkNN(&local_108,local_58,(local_50->field_2).childs[0]);
              iVar1 = local_24;
              local_24 = local_24 + 1;
              psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[]
                                 ((btAlignedObjectArray<btDbvt::sStkNN> *)(in_RDI + 2),iVar1);
              psVar3->a = local_108.a;
              psVar3->b = local_108.b;
              sStkNN::sStkNN((sStkNN *)&stack0xfffffffffffffee8,local_58,
                             (local_50->field_2).childs[1]);
              iVar1 = local_24;
              local_24 = local_24 + 1;
              psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[]
                                 ((btAlignedObjectArray<btDbvt::sStkNN> *)(in_RDI + 2),iVar1);
              psVar3->a = (btDbvtNode *)
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
              psVar3->b = in_stack_fffffffffffffef0;
            }
            else {
              (**(code **)(*local_20 + 0x10))(local_20,local_58,local_50);
            }
          }
        }
      }
    } while (local_24 != 0);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void		btDbvt::collideTTpersistentStack(	const btDbvtNode* root0,
								  const btDbvtNode* root1,
								  DBVT_IPOLICY)
{
	DBVT_CHECKTYPE
		if(root0&&root1)
		{
			int								depth=1;
			int								treshold=DOUBLE_STACKSIZE-4;
			
			m_stkStack.resize(DOUBLE_STACKSIZE);
			m_stkStack[0]=sStkNN(root0,root1);
			do	{		
				sStkNN	p=m_stkStack[--depth];
				if(depth>treshold)
				{
					m_stkStack.resize(m_stkStack.size()*2);
					treshold=m_stkStack.size()-4;
				}
				if(p.a==p.b)
				{
					if(p.a->isinternal())
					{
						m_stkStack[depth++]=sStkNN(p.a->childs[0],p.a->childs[0]);
						m_stkStack[depth++]=sStkNN(p.a->childs[1],p.a->childs[1]);
						m_stkStack[depth++]=sStkNN(p.a->childs[0],p.a->childs[1]);
					}
				}
				else if(Intersect(p.a->volume,p.b->volume))
				{
					if(p.a->isinternal())
					{
						if(p.b->isinternal())
						{
							m_stkStack[depth++]=sStkNN(p.a->childs[0],p.b->childs[0]);
							m_stkStack[depth++]=sStkNN(p.a->childs[1],p.b->childs[0]);
							m_stkStack[depth++]=sStkNN(p.a->childs[0],p.b->childs[1]);
							m_stkStack[depth++]=sStkNN(p.a->childs[1],p.b->childs[1]);
						}
						else
						{
							m_stkStack[depth++]=sStkNN(p.a->childs[0],p.b);
							m_stkStack[depth++]=sStkNN(p.a->childs[1],p.b);
						}
					}
					else
					{
						if(p.b->isinternal())
						{
							m_stkStack[depth++]=sStkNN(p.a,p.b->childs[0]);
							m_stkStack[depth++]=sStkNN(p.a,p.b->childs[1]);
						}
						else
						{
							policy.Process(p.a,p.b);
						}
					}
				}
			} while(depth);
		}
}